

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

void __thiscall libtorrent::dht::dht_tracker::update_storage_node_ids(dht_tracker *this)

{
  _Base_ptr p_Var1;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> ids;
  _Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::push_back
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               &local_38,(value_type *)&p_Var1[4]._M_left);
  }
  (*this->m_storage->_vptr_dht_storage_interface[2])(this->m_storage,&local_38);
  std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
  ~_Vector_base(&local_38);
  return;
}

Assistant:

void dht_tracker::update_storage_node_ids()
	{
		std::vector<sha1_hash> ids;
		for (auto& n : m_nodes)
			ids.push_back(n.second.dht.nid());
		m_storage.update_node_ids(ids);
	}